

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

SrcList * targetSrcList(Parse *pParse,TriggerStep *pStep)

{
  int iVar1;
  SrcList *z;
  char *pcVar2;
  SrcList *in_RSI;
  sqlite3 *in_RDI;
  sqlite3 *db;
  SrcList *pSrc;
  int iDb;
  Token *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  z = sqlite3SrcListAppend
                (in_RDI,in_RSI,
                 (Token *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                 in_stack_ffffffffffffffe0);
  if ((z != (SrcList *)0x0) &&
     ((iVar1 = sqlite3SchemaToIndex
                         ((sqlite3 *)in_RDI->pVfs,(Schema *)((in_RSI->a[0].pSchema)->idxHash).first)
      , iVar1 == 0 || (1 < iVar1)))) {
    pcVar2 = sqlite3DbStrDup((sqlite3 *)CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)z);
    z->a[z->nSrc + -1].zDatabase = pcVar2;
  }
  return z;
}

Assistant:

static SrcList *targetSrcList(
  Parse *pParse,       /* The parsing context */
  TriggerStep *pStep   /* The trigger containing the target token */
){
  int iDb;             /* Index of the database to use */
  SrcList *pSrc;       /* SrcList to be returned */

  pSrc = sqlite3SrcListAppend(pParse->db, 0, &pStep->target, 0);
  if( pSrc ){
    assert( pSrc->nSrc>0 );
    assert( pSrc->a!=0 );
    iDb = sqlite3SchemaToIndex(pParse->db, pStep->pTrig->pSchema);
    if( iDb==0 || iDb>=2 ){
      sqlite3 *db = pParse->db;
      assert( iDb<pParse->db->nDb );
      pSrc->a[pSrc->nSrc-1].zDatabase = sqlite3DbStrDup(db, db->aDb[iDb].zName);
    }
  }
  return pSrc;
}